

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O0

section_entry_t * read_section_entry(void)

{
  int iVar1;
  section_type_t sVar2;
  section_entry_t *size;
  uchar *puVar3;
  section_entry_t *sect;
  
  size = (section_entry_t *)mmalloc((size_t)sect);
  iVar1 = read_int32();
  size->id = iVar1;
  sVar2 = read_int32();
  size->type = sVar2;
  iVar1 = read_int16();
  size->offset = iVar1;
  iVar1 = read_int32();
  size->bank_num = iVar1;
  iVar1 = read_int32();
  size->data_size = iVar1;
  if (size->type != org) {
    err(F,"invalid object file: unknown section type");
  }
  puVar3 = (uchar *)mmalloc((size_t)sect);
  size->data = puVar3;
  read_data((uchar *)sect,(size_t)size);
  return size;
}

Assistant:

section_entry_t* read_section_entry()
{
    section_entry_t* sect = (section_entry_t*)mmalloc(sizeof(section_entry_t));
    sect->id = read_int32();
    sect->type = read_int32();
    sect->offset = read_int16();
    sect->bank_num = read_int32();
    sect->data_size = read_int32();
    if (sect->type < org || sect->type > org)
        err(F, "invalid object file: unknown section type");
    sect->data = (unsigned char*)mmalloc(sect->data_size);
    read_data(sect->data, sect->data_size);
    return sect;
}